

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

string * __thiscall
KokkosTools::SpaceTimeStack::StackNode::get_full_name_abi_cxx11_
          (string *__return_storage_ptr__,StackNode *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  StackNode *local_28;
  StackNode *p;
  StackNode *local_18;
  StackNode *this_local;
  string *full_name;
  
  p._7_1_ = 0;
  local_18 = this;
  this_local = (StackNode *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  for (local_28 = this->parent; local_28 != (StackNode *)0x0; local_28 = local_28->parent) {
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) || (local_28->parent != (StackNode *)0x0)) {
      std::operator+(&local_68,&local_28->name,'/');
      std::operator+(&local_48,&local_68,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_full_name() const {
    std::string full_name = this->name;
    for (auto p = this->parent; p; p = p->parent) {
      if (p->name.empty() && !p->parent) continue;
      full_name = p->name + '/' + full_name;
    }
    return full_name;
  }